

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentTest::SubTestStatus
          (TextureAttachmentTest *this,GLenum attachment,GLenum texture_target,GLuint level,
          GLuint levels)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x170))(0x8d40);
  if (iVar1 != 0x8cd5) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "Named Framebuffer Texture Attachment test failed because of framebuffer ",0x48);
    local_1c0.m_getName = glu::getFramebufferStatusName;
    local_1c0.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," status with ",0xd);
    local_1d0.m_getName = glu::getTextureTargetName;
    local_1d0.m_value = texture_target;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," texture set up as ",0x13);
    local_1e0.m_getName = glu::getFramebufferAttachmentName;
    local_1e0.m_value = attachment;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," attachment and texture level ",0x1e);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," of texture with ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," levels.",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return iVar1 == 0x8cd5;
}

Assistant:

bool TextureAttachmentTest::SubTestStatus(glw::GLenum attachment, glw::GLenum texture_target, glw::GLuint level,
										  glw::GLuint levels)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);

	if (GL_FRAMEBUFFER_COMPLETE != status)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Named Framebuffer Texture Attachment test failed because of framebuffer "
			<< glu::getFramebufferStatusStr(status) << " status with " << glu::getTextureTargetStr(texture_target)
			<< " texture set up as " << glu::getFramebufferAttachmentStr(attachment) << " attachment and texture level "
			<< level << " of texture with " << levels << " levels." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}